

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CategoricalMapping.pb.h
# Opt level: O1

bool CoreML::Specification::operator==(CategoricalMapping *a,CategoricalMapping *b)

{
  uint32_t uVar1;
  uint32_t uVar2;
  bool bVar3;
  undefined1 *puVar4;
  undefined1 *puVar5;
  
  uVar1 = a->_oneof_case_[0];
  uVar2 = b->_oneof_case_[0];
  if (uVar1 != uVar2) {
    return false;
  }
  if (uVar1 != 0) {
    if (uVar1 == 1) {
      puVar4 = _StringToInt64Map_default_instance_;
      puVar5 = _StringToInt64Map_default_instance_;
      if (uVar1 == 1) {
        puVar5 = (undefined1 *)(a->MappingType_).stringtoint64map_;
      }
      if (uVar2 == 1) {
        puVar4 = (undefined1 *)(b->MappingType_).stringtoint64map_;
      }
      bVar3 = operator==(&(((StringToInt64Map *)puVar5)->map_).map_,
                         &(((StringToInt64Map *)puVar4)->map_).map_);
      return bVar3;
    }
    puVar4 = _Int64ToStringMap_default_instance_;
    puVar5 = _Int64ToStringMap_default_instance_;
    if (uVar1 == 2) {
      puVar5 = (undefined1 *)(a->MappingType_).stringtoint64map_;
    }
    if (uVar2 == 2) {
      puVar4 = (undefined1 *)(b->MappingType_).stringtoint64map_;
    }
    bVar3 = operator==((Map<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&((StringToInt64Map *)puVar5)->map_,
                       (Map<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&((StringToInt64Map *)puVar4)->map_);
    return bVar3;
  }
  return true;
}

Assistant:

inline CategoricalMapping::MappingTypeCase CategoricalMapping::MappingType_case() const {
  return CategoricalMapping::MappingTypeCase(_oneof_case_[0]);
}